

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

void rhash_sha512_update(sha512_ctx *ctx,uchar *msg,size_t size)

{
  size_t __n;
  sha512_ctx *block;
  ulong uVar1;
  ulong uVar2;
  sha512_ctx *__src;
  bool bVar3;
  
  uVar1 = ctx->length;
  ctx->length = uVar1 + size;
  uVar1 = uVar1 & 0x7f;
  if (uVar1 != 0) {
    uVar2 = 0x80 - uVar1;
    __n = size;
    if (uVar2 < size) {
      __n = uVar2;
    }
    memcpy((void *)((long)ctx->message + uVar1),msg,__n);
    bVar3 = size < uVar2;
    size = size - uVar2;
    if (bVar3) {
      return;
    }
    rhash_sha512_process_block(ctx->hash,ctx->message);
    msg = msg + uVar2;
  }
  __src = (sha512_ctx *)msg;
  for (; 0x7f < size; size = size - 0x80) {
    block = __src;
    if (((ulong)msg & 7) != 0) {
      memcpy(ctx,__src,0x80);
      block = ctx;
    }
    rhash_sha512_process_block(ctx->hash,block->message);
    __src = (sha512_ctx *)&__src->length;
  }
  if (size == 0) {
    return;
  }
  memcpy(ctx,__src,size);
  return;
}

Assistant:

void rhash_sha512_update(sha512_ctx* ctx, const unsigned char* msg, size_t size)
{
	size_t index = (size_t)ctx->length & 127;
	ctx->length += size;

	/* fill partial block */
	if (index) {
		size_t left = sha512_block_size - index;
		memcpy((char*)ctx->message + index, msg, (size < left ? size : left));
		if (size < left) return;

		/* process partial block */
		rhash_sha512_process_block(ctx->hash, ctx->message);
		msg  += left;
		size -= left;
	}
	while (size >= sha512_block_size) {
		uint64_t* aligned_message_block;
		if (IS_ALIGNED_64(msg)) {
			/* the most common case is processing of an already aligned message
			without copying it */
			aligned_message_block = (uint64_t*)msg;
		} else {
			memcpy(ctx->message, msg, sha512_block_size);
			aligned_message_block = ctx->message;
		}

		rhash_sha512_process_block(ctx->hash, aligned_message_block);
		msg  += sha512_block_size;
		size -= sha512_block_size;
	}
	if (size) {
		memcpy(ctx->message, msg, size); /* save leftovers */
	}
}